

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_arm_regression.c
# Opt level: O2

int main(void)

{
  long lVar1;
  uint uVar2;
  uchar *puVar3;
  cs_insn *pcVar4;
  cs_err cVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  size_t __n;
  size_t sVar10;
  long lVar11;
  size_t sVar12;
  long lVar13;
  bool bVar14;
  long lStack_870;
  cs_insn *insn;
  size_t left;
  size_t cur;
  char *local_848;
  size_t local_840;
  char a_buf [2048];
  
  puts("\nShould be invalid\n-----------------");
  cVar5 = cs_open(CS_ARCH_ARM,CS_MODE_MICRO,&handle);
  if (cVar5 == CS_ERR_OK) {
    cs_option(handle,CS_OPT_DETAIL,3);
    cs_option(handle,CS_OPT_SYNTAX,3);
    bVar14 = true;
    lStack_870 = 0;
    while (bVar14) {
      puVar3 = (&PTR_anon_var_dwarf_49_00268188)[lStack_870 * 3];
      local_848 = (char *)(&DAT_00268190)[lStack_870 * 3];
      pcVar7 = hex_string(puVar3,(size_t)local_848);
      printf("%s %s: %s\n","Thumb",pcVar7,(&PTR_anon_var_dwarf_5f_00268198)[lStack_870 * 3]);
      free(pcVar7);
      sVar9 = cs_disasm(handle,puVar3,(size_t)local_848,0x1000,0,&insn);
      if (sVar9 == 0) {
        puts("    SUCCESS: invalid");
      }
      else {
        puts("    ERROR:");
        lVar11 = 0;
        sVar12 = sVar9;
        while( true ) {
          bVar14 = sVar12 == 0;
          sVar12 = sVar12 - 1;
          if (bVar14) break;
          printf("    0x%lx:\t%s\t%s\n",*(undefined8 *)(insn->bytes + lVar11 + -10),
                 insn->mnemonic + lVar11,insn->op_str + lVar11);
          cur = 0;
          left = 0x800;
          snprint_insn_detail(a_buf,&cur,&left,(cs_insn *)(insn->bytes + lVar11 + -0x12));
          puts(a_buf);
          lVar11 = lVar11 + 0xf0;
        }
        cs_free(insn,sVar9);
      }
      bVar14 = false;
      lStack_870 = 1;
    }
    cs_close(&handle);
  }
  else {
    printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar5);
  }
  cVar5 = cs_open(CS_ARCH_ARM,CS_MODE_MICRO,&handle);
  if (cVar5 == CS_ERR_OK) {
    cs_option(handle,CS_OPT_DETAIL,3);
    cs_option(handle,CS_OPT_SYNTAX,3);
    puts("\nShould be valid\n---------------");
    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
      insn = (cs_insn *)0x0;
      left = 0x800;
      puVar3 = (&PTR_anon_var_dwarf_244_00268328)[lVar11 * 5];
      sVar9 = (&DAT_00268330)[lVar11 * 5];
      pcVar8 = hex_string(puVar3,sVar9);
      uVar2 = (&DAT_00268338)[lVar11 * 10];
      pcVar7 = (&PTR_anon_var_dwarf_24f_00268340)[lVar11 * 5];
      printf("%s %s @ 0x%04x: %s\n    %s","Thumb",pcVar8,(ulong)uVar2,
             (&PTR_anon_var_dwarf_266_00268348)[lVar11 * 5],pcVar7);
      sVar9 = cs_disasm(handle,puVar3,sVar9,(ulong)uVar2,0,(cs_insn **)&cur);
      if (sVar9 == 0) {
        puts("ERROR: invalid");
      }
      else {
        lVar13 = 0;
        local_848 = pcVar7;
        local_840 = sVar9;
        while (sVar12 = left, pcVar4 = insn, bVar14 = sVar9 != 0, sVar9 = sVar9 - 1, bVar14) {
          lVar1 = cur + 0x22 + lVar13;
          iVar6 = snprintf(a_buf + (long)insn,left,"0x%lx:\t%s\t%s\n",*(undefined8 *)(lVar1 + -0x1a)
                           ,lVar1,cur + lVar13 + 0x42);
          left = sVar12 - (long)iVar6;
          insn = (cs_insn *)(pcVar4->bytes + (long)iVar6 + -0x12);
          snprint_insn_detail(a_buf,(size_t *)&insn,&left,(cs_insn *)(cur + lVar13));
          lVar13 = lVar13 + 0xf0;
        }
        __n = strlen(a_buf);
        pcVar7 = local_848;
        sVar10 = strlen(local_848);
        if (__n < sVar10) {
          __n = sVar10;
        }
        iVar6 = bcmp(a_buf,pcVar7,__n);
        if (iVar6 == 0) {
          puts("    SUCCESS: valid");
        }
        else {
          printf("    ERROR: \'\'\'\n%s\'\'\' does not match expected \'\'\'\n%s\'\'\'\n",a_buf,
                 pcVar7);
        }
        cs_free((cs_insn *)cur,local_840);
      }
    }
    cs_close(&handle);
  }
  else {
    printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar5);
  }
  return 0;
}

Assistant:

static void test_invalids()
{
	struct invalid_instructions invalids[] = {{
		CS_ARCH_ARM,
			CS_MODE_THUMB,
			"Thumb",
			1,
			{{
				 (unsigned char *)"\xbd\xe8\x1e\xff",
				 4,
				 "invalid thumb2 pop because sp used and because both pc and lr are "
					 "present at the same time"
			 }},
	}};

	struct invalid_instructions * invalid = NULL;

	uint64_t address = 0x1000;
	cs_insn *insn;
	int i;
	int j;
	size_t count;

	printf("\nShould be invalid\n"
			"-----------------\n");

	for (i = 0; i < sizeof(invalids)/sizeof(invalids[0]); i++) {
		cs_err err;

		invalid = invalids + i;
		err = cs_open(invalid->arch, invalid->mode, &handle);

		if (err) {
			printf("Failed on cs_open() with error returned: %u\n", err);
			continue;
		}

		cs_option(handle, CS_OPT_DETAIL, CS_OPT_ON);
		cs_option(handle, CS_OPT_SYNTAX, CS_OPT_SYNTAX_NOREGNAME);

		for (j = 0; j < invalid->num_invalid_codes; ++j) {
			struct invalid_code *invalid_code = NULL;
			char *hex_str = NULL;

			invalid_code = invalid->invalid_codes + j;

			hex_str = hex_string(invalid_code->code, invalid_code->size);

			printf("%s %s: %s\n", invalid->platform_comment, hex_str, invalid_code->comment);

			free(hex_str);

			count = cs_disasm(handle,
					invalid_code->code, invalid_code->size, address, 0, &insn
					);

			if (count) {
				size_t k;
				printf("    ERROR:\n");

				for (k = 0; k < count; k++) {
					printf("    0x%"PRIx64":\t%s\t%s\n", 
							insn[k].address, insn[k].mnemonic, insn[k].op_str);
					print_insn_detail(&insn[k]);
				}
				cs_free(insn, count);

			} else {
				printf("    SUCCESS: invalid\n");
			}
		}

		cs_close(&handle);
	}
}